

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialRuntimeObjects.cpp
# Opt level: O0

void __thiscall
Lodtalk::SpecialRuntimeObjects::createSpecialObjectTable(SpecialRuntimeObjects *this)

{
  size_type sVar1;
  anon_union_8_4_0eb573b0_for_Oop_0 local_210;
  anon_union_8_4_0eb573b0_for_Oop_0 local_208;
  anon_union_8_4_0eb573b0_for_Oop_0 local_200;
  anon_union_8_4_0eb573b0_for_Oop_0 local_1f8;
  anon_union_8_4_0eb573b0_for_Oop_0 local_1f0;
  anon_union_8_4_0eb573b0_for_Oop_0 local_1e8;
  anon_union_8_4_0eb573b0_for_Oop_0 local_1e0;
  anon_union_8_4_0eb573b0_for_Oop_0 local_1d8;
  anon_union_8_4_0eb573b0_for_Oop_0 local_1d0;
  anon_union_8_4_0eb573b0_for_Oop_0 local_1c8;
  anon_union_8_4_0eb573b0_for_Oop_0 local_1c0;
  anon_union_8_4_0eb573b0_for_Oop_0 local_1b8;
  anon_union_8_4_0eb573b0_for_Oop_0 local_1b0;
  anon_union_8_4_0eb573b0_for_Oop_0 local_1a8;
  anon_union_8_4_0eb573b0_for_Oop_0 local_1a0;
  anon_union_8_4_0eb573b0_for_Oop_0 local_198;
  anon_union_8_4_0eb573b0_for_Oop_0 local_190;
  anon_union_8_4_0eb573b0_for_Oop_0 local_188;
  anon_union_8_4_0eb573b0_for_Oop_0 local_180;
  anon_union_8_4_0eb573b0_for_Oop_0 local_178;
  anon_union_8_4_0eb573b0_for_Oop_0 local_170;
  anon_union_8_4_0eb573b0_for_Oop_0 local_168;
  anon_union_8_4_0eb573b0_for_Oop_0 local_160;
  anon_union_8_4_0eb573b0_for_Oop_0 local_158;
  anon_union_8_4_0eb573b0_for_Oop_0 local_150;
  anon_union_8_4_0eb573b0_for_Oop_0 local_148;
  Oop local_140;
  anon_union_8_4_0eb573b0_for_Oop_0 local_138;
  anon_union_8_4_0eb573b0_for_Oop_0 local_130;
  anon_union_8_4_0eb573b0_for_Oop_0 local_128;
  anon_union_8_4_0eb573b0_for_Oop_0 local_120;
  anon_union_8_4_0eb573b0_for_Oop_0 local_118;
  anon_union_8_4_0eb573b0_for_Oop_0 local_110;
  anon_union_8_4_0eb573b0_for_Oop_0 local_108;
  anon_union_8_4_0eb573b0_for_Oop_0 local_100;
  anon_union_8_4_0eb573b0_for_Oop_0 local_f8;
  anon_union_8_4_0eb573b0_for_Oop_0 local_f0;
  anon_union_8_4_0eb573b0_for_Oop_0 local_e8;
  anon_union_8_4_0eb573b0_for_Oop_0 local_e0;
  anon_union_8_4_0eb573b0_for_Oop_0 local_d8;
  anon_union_8_4_0eb573b0_for_Oop_0 local_d0;
  anon_union_8_4_0eb573b0_for_Oop_0 local_c8;
  anon_union_8_4_0eb573b0_for_Oop_0 local_c0;
  anon_union_8_4_0eb573b0_for_Oop_0 local_b8;
  anon_union_8_4_0eb573b0_for_Oop_0 local_b0;
  anon_union_8_4_0eb573b0_for_Oop_0 local_a8;
  anon_union_8_4_0eb573b0_for_Oop_0 local_a0;
  anon_union_8_4_0eb573b0_for_Oop_0 local_98;
  anon_union_8_4_0eb573b0_for_Oop_0 local_90;
  anon_union_8_4_0eb573b0_for_Oop_0 local_88;
  anon_union_8_4_0eb573b0_for_Oop_0 local_80;
  anon_union_8_4_0eb573b0_for_Oop_0 local_78;
  anon_union_8_4_0eb573b0_for_Oop_0 local_70;
  anon_union_8_4_0eb573b0_for_Oop_0 local_68;
  anon_union_8_4_0eb573b0_for_Oop_0 local_60;
  anon_union_8_4_0eb573b0_for_Oop_0 local_58;
  anon_union_8_4_0eb573b0_for_Oop_0 local_50;
  anon_union_8_4_0eb573b0_for_Oop_0 local_48;
  anon_union_8_4_0eb573b0_for_Oop_0 local_40;
  anon_union_8_4_0eb573b0_for_Oop_0 local_38 [3];
  anon_union_8_4_0eb573b0_for_Oop_0 local_20;
  WithoutGC local_18;
  WithoutGC wgc;
  SpecialRuntimeObjects *this_local;
  
  wgc.context = (VMContext *)this;
  WithoutGC::WithoutGC(&local_18,this->context);
  local_20 = (anon_union_8_4_0eb573b0_for_Oop_0)nilOop();
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_20);
  local_38[0] = (anon_union_8_4_0eb573b0_for_Oop_0)trueOop();
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)local_38);
  local_40 = (anon_union_8_4_0eb573b0_for_Oop_0)falseOop();
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_40);
  sVar1 = std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::size(&this->specialObjectTable);
  this->blockActivationSelectorFirst = sVar1;
  local_48 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"value");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_48);
  local_50 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"value:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_50);
  local_58 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"value:value:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_58);
  local_60 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"value:value:value:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_60);
  local_68 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"value:value:value:value:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_68);
  local_70 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"value:value:value:value:value:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_70);
  local_78 = (anon_union_8_4_0eb573b0_for_Oop_0)
             makeSelector(this,"value:value:value:value:value:value:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_78);
  sVar1 = std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::size(&this->specialObjectTable);
  this->blockActivationSelectorCount = sVar1 - this->blockActivationSelectorFirst;
  sVar1 = std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::size(&this->specialObjectTable);
  this->specialMessageSelectorFirst = sVar1;
  local_80 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"+");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_80);
  local_88 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"-");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_88);
  local_90 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"<");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_90);
  local_98 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,">");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_98);
  local_a0 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"<=");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_a0);
  local_a8 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,">=");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_a8);
  local_b0 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"=");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_b0);
  local_b8 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"~=");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_b8);
  local_c0 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"*");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_c0);
  local_c8 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"/");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_c8);
  local_d0 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"\\\\");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_d0);
  local_d8 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"@");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_d8);
  local_e0 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"bitShift:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_e0);
  local_e8 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"//");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_e8);
  local_f0 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"bitAnd:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_f0);
  local_f8 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"bitOr:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_f8);
  local_100 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"at:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_100);
  local_108 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"at:put:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_108);
  local_110 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"size");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_110);
  local_118 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"next");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_118);
  local_120 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"nextPut:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_120);
  local_128 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"atEnd");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_128);
  local_130 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"==");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_130);
  local_138 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"class");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_138);
  Oop::Oop(&local_140);
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,&local_140);
  local_148 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"value");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_148);
  local_150 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"value:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_150);
  local_158 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"do:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_158);
  local_160 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"new");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_160);
  local_168 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"new:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_168);
  local_170 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"x");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_170);
  local_178 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"y");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_178);
  local_180 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"basicNew");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_180);
  local_188 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"basicNew:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_188);
  local_190 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"doesNotUnderstand:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_190);
  local_198 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"nativeMethodFailed:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_198);
  sVar1 = std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::size(&this->specialObjectTable);
  this->specialMessageSelectorCount = sVar1 - this->specialMessageSelectorFirst;
  if (this->specialMessageSelectorCount != 0x24) {
    __assert_fail("specialMessageSelectorCount == (size_t)SpecialMessageSelector::SpecialMessageCount"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/SpecialRuntimeObjects.cpp"
                  ,99,"void Lodtalk::SpecialRuntimeObjects::createSpecialObjectTable()");
  }
  sVar1 = std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::size(&this->specialObjectTable);
  this->compilerMessageSelectorFirst = sVar1;
  local_1a0 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"ifTrue:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_1a0);
  local_1a8 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"ifFalse:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_1a8);
  local_1b0 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"ifTrue:ifFalse:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_1b0);
  local_1b8 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"ifFalse:ifTrue:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_1b8);
  local_1c0 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"ifNil:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_1c0);
  local_1c8 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"ifNotNil:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_1c8);
  local_1d0 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"ifNil:ifNotNil:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_1d0);
  local_1d8 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"ifNotNil:ifNil:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_1d8);
  local_1e0 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"whileTrue:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_1e0);
  local_1e8 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"whileFalse:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_1e8);
  local_1f0 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"repeat");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_1f0);
  local_1f8 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"doWhileTrue:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_1f8);
  local_200 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"doWhileFalse:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_200);
  local_208 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"to:by:do:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_208);
  local_210 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"to:do:");
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::push_back
            (&this->specialObjectTable,(value_type *)&local_210);
  sVar1 = std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::size(&this->specialObjectTable);
  this->compilerMessageSelectorCount = sVar1 - this->compilerMessageSelectorFirst;
  if (this->compilerMessageSelectorCount == 0xf) {
    WithoutGC::~WithoutGC(&local_18);
    return;
  }
  __assert_fail("compilerMessageSelectorCount == (size_t)CompilerOptimizedSelector::CompilerMessageCount"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/SpecialRuntimeObjects.cpp"
                ,0x7b,"void Lodtalk::SpecialRuntimeObjects::createSpecialObjectTable()");
}

Assistant:

void SpecialRuntimeObjects::createSpecialObjectTable()
{
    WithoutGC wgc(context);

	specialObjectTable.push_back(nilOop());
	specialObjectTable.push_back(trueOop());
	specialObjectTable.push_back(falseOop());

    // Block activation selectors
    blockActivationSelectorFirst = specialObjectTable.size();
    specialObjectTable.push_back(makeSelector("value"));
    specialObjectTable.push_back(makeSelector("value:"));
    specialObjectTable.push_back(makeSelector("value:value:"));
    specialObjectTable.push_back(makeSelector("value:value:value:"));
    specialObjectTable.push_back(makeSelector("value:value:value:value:"));
    specialObjectTable.push_back(makeSelector("value:value:value:value:value:"));
    specialObjectTable.push_back(makeSelector("value:value:value:value:value:value:"));
    blockActivationSelectorCount = specialObjectTable.size() - blockActivationSelectorFirst;

    // Special message selectors
    specialMessageSelectorFirst = specialObjectTable.size();

    // Arithmetic messages
    specialObjectTable.push_back(makeSelector("+"));
    specialObjectTable.push_back(makeSelector("-"));
    specialObjectTable.push_back(makeSelector("<"));
    specialObjectTable.push_back(makeSelector(">"));
    specialObjectTable.push_back(makeSelector("<="));
    specialObjectTable.push_back(makeSelector(">="));
    specialObjectTable.push_back(makeSelector("="));
    specialObjectTable.push_back(makeSelector("~="));
    specialObjectTable.push_back(makeSelector("*"));
    specialObjectTable.push_back(makeSelector("/"));
    specialObjectTable.push_back(makeSelector("\\\\"));
    specialObjectTable.push_back(makeSelector("@"));
    specialObjectTable.push_back(makeSelector("bitShift:"));
    specialObjectTable.push_back(makeSelector("//"));
    specialObjectTable.push_back(makeSelector("bitAnd:"));
    specialObjectTable.push_back(makeSelector("bitOr:"));

    // Object accessing messages.
    specialObjectTable.push_back(makeSelector("at:"));
    specialObjectTable.push_back(makeSelector("at:put:"));
    specialObjectTable.push_back(makeSelector("size"));
    specialObjectTable.push_back(makeSelector("next"));
    specialObjectTable.push_back(makeSelector("nextPut:"));
    specialObjectTable.push_back(makeSelector("atEnd"));
    specialObjectTable.push_back(makeSelector("=="));
    specialObjectTable.push_back(makeSelector("class"));

    specialObjectTable.push_back(Oop()); // Unassigned

    // Block evaluation.
    specialObjectTable.push_back(makeSelector("value"));
    specialObjectTable.push_back(makeSelector("value:"));
    specialObjectTable.push_back(makeSelector("do:"));

    // Object instantiation.
    specialObjectTable.push_back(makeSelector("new"));
    specialObjectTable.push_back(makeSelector("new:"));
    specialObjectTable.push_back(makeSelector("x"));
    specialObjectTable.push_back(makeSelector("y"));
    specialObjectTable.push_back(makeSelector("basicNew"));
    specialObjectTable.push_back(makeSelector("basicNew:"));

    // Does not understand
    specialObjectTable.push_back(makeSelector("doesNotUnderstand:"));
    specialObjectTable.push_back(makeSelector("nativeMethodFailed:"));

    specialMessageSelectorCount = specialObjectTable.size() - specialMessageSelectorFirst;
    assert(specialMessageSelectorCount == (size_t)SpecialMessageSelector::SpecialMessageCount);

    compilerMessageSelectorFirst = specialObjectTable.size();
    specialObjectTable.push_back(makeSelector("ifTrue:"));
    specialObjectTable.push_back(makeSelector("ifFalse:"));
    specialObjectTable.push_back(makeSelector("ifTrue:ifFalse:"));
    specialObjectTable.push_back(makeSelector("ifFalse:ifTrue:"));
    specialObjectTable.push_back(makeSelector("ifNil:"));
    specialObjectTable.push_back(makeSelector("ifNotNil:"));
    specialObjectTable.push_back(makeSelector("ifNil:ifNotNil:"));
    specialObjectTable.push_back(makeSelector("ifNotNil:ifNil:"));

    // Loops
    specialObjectTable.push_back(makeSelector("whileTrue:"));
    specialObjectTable.push_back(makeSelector("whileFalse:"));
    specialObjectTable.push_back(makeSelector("repeat"));
    specialObjectTable.push_back(makeSelector("doWhileTrue:"));
    specialObjectTable.push_back(makeSelector("doWhileFalse:"));

    // Iteration
    specialObjectTable.push_back(makeSelector("to:by:do:"));
    specialObjectTable.push_back(makeSelector("to:do:"));

    compilerMessageSelectorCount = specialObjectTable.size() - compilerMessageSelectorFirst;
    assert(compilerMessageSelectorCount == (size_t)CompilerOptimizedSelector::CompilerMessageCount);
}